

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TerminalPrinter.cpp
# Opt level: O2

void pobr::utils::TerminalPrinter::printLabel(string *message,string *color)

{
  ostream *poVar1;
  stringstream temp;
  string sStack_1d8;
  string local_1b8;
  stringstream local_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::operator<<(local_188,"[");
  poVar1 = std::operator<<(poVar1,(string *)message);
  std::operator<<(poVar1,"]");
  std::__cxx11::stringbuf::str();
  colorize(&local_1b8,&sStack_1d8,color);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_1b8);
  std::operator<<(poVar1," ");
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&sStack_1d8);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

void
TerminalPrinter::printLabel(const std::string& message, const std::string& color)
{
    std::stringstream temp;

    temp << "[" << message << "]";

    std::cout << TerminalPrinter::colorize(temp.str(), color)
              << " ";
}